

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0,void*&>
               (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
                *location,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,Type *params_1,
               void **params_2)

{
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
  *this;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *dependency;
  Type *func;
  void **ppvVar1;
  void **params_local_2;
  Type *params_local_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
  *location_local;
  
  this = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
          *)operator_new(0x40);
  if (this != (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
               *)0x0) {
    dependency = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params);
    func = fwd<capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>
                     (params_1);
    ppvVar1 = fwd<void*&>(params_2);
    _::
    SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
    ::SimpleTransformPromiseNode(this,dependency,func,*ppvVar1);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}